

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O0

int __thiscall
crawler::Node::select
          (Node *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined4 in_register_00000034;
  fd_set *local_20;
  Evaluator *evaluator_local;
  Node *this_local;
  
  evaluator_local = (Evaluator *)CONCAT44(in_register_00000034,__nfds);
  local_20 = __readfds;
  this_local = this;
  getElementsByPredicate<crawler::Node::select(crawler::Evaluator*)::__0>
            (&this->children,(Node *)evaluator_local,(anon_class_8_1_40896ecf)&local_20);
  return (int)this;
}

Assistant:

crawler::Nodes crawler::Node::select(Evaluator *evaluator) {
  return getElementsByPredicate([&evaluator](const Node &node) -> bool {
    return evaluator->matches(node);
  });
}